

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O0

bool aeron::util::MemoryMappedFile::fill(FileHandle fd,size_t size,uint8_t value)

{
  pointer puVar1;
  ulong uVar2;
  byte in_DL;
  ulong in_RSI;
  int in_EDI;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> buffer;
  uchar *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined8 local_10;
  undefined1 local_1;
  
  operator_new__(m_page_size);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  memset(puVar1,(uint)in_DL,m_page_size);
  for (local_10 = in_RSI; m_page_size <= local_10; local_10 = local_10 - m_page_size) {
    puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    uVar2 = write(in_EDI,puVar1,m_page_size);
    if (uVar2 != m_page_size) {
      local_1 = false;
      goto LAB_001f09ef;
    }
  }
  if (local_10 != 0) {
    puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        CONCAT44(in_EDI,in_stack_ffffffffffffffb0));
    uVar2 = write(in_EDI,puVar1,local_10);
    in_stack_ffffffffffffffb4 = in_EDI;
    if (uVar2 != local_10) {
      local_1 = false;
      goto LAB_001f09ef;
    }
  }
  local_1 = true;
LAB_001f09ef:
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return local_1;
}

Assistant:

bool MemoryMappedFile::fill(FileHandle fd, size_t size, uint8_t value)
{
    std::unique_ptr<uint8_t[]> buffer(new uint8_t[m_page_size]);
    memset(buffer.get(), value, m_page_size);

    while (size >= m_page_size)
    {
        if (static_cast<size_t>(write(fd.handle, buffer.get(), m_page_size)) != m_page_size)
        {
            return false;
        }

        size -= m_page_size;
    }

    if (size)
    {
        if (static_cast<size_t>(write(fd.handle, buffer.get(), size)) != size)
        {
            return false;
        }
    }
    return true;
}